

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PFileReceiver.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  OutputWorker *pOVar2;
  char *pcVar3;
  shared_ptr<FileReceiverServerConnection> connection;
  string hostname;
  SDKJsonResult result;
  P2PFileReceiver receiver;
  __shared_ptr<FileReceiverServerConnection,_(__gnu_cxx::_Lock_policy)2> local_2b8;
  string local_2a0;
  string local_280 [32];
  P2PFileReceiver *local_260;
  string local_258 [32];
  undefined1 local_238 [16];
  ostringstream local_228 [376];
  P2PFileReceiver local_b0;
  
  std::__cxx11::string::string((string *)&local_2a0,"127.0.0.1",(allocator *)local_238);
  if (argc < 2) {
    if (argc == 1) {
      pcVar3 = *argv;
    }
    else {
      pcVar3 = "P2PFileSender";
    }
    if ((int)Logger.ChannelMinLevel < 3) {
      local_238._0_8_ = Logger.ChannelName;
      local_238._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(local_228);
      std::operator<<((ostream *)local_228,(string *)&Logger.Prefix);
      std::operator<<((ostream *)local_228,"Usage: ");
      std::operator<<((ostream *)local_228,pcVar3);
      std::operator<<((ostream *)local_228," <Rendezvous Server Hostname>");
      pOVar2 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_238);
      goto LAB_001040ba;
    }
  }
  else {
    std::__cxx11::string::assign((char *)&local_2a0);
    if ((int)Logger.ChannelMinLevel < 3) {
      local_238._0_8_ = Logger.ChannelName;
      local_238._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(local_228);
      std::operator<<((ostream *)local_228,(string *)&Logger.Prefix);
      std::operator<<((ostream *)local_228,"Server hostname: ");
      std::operator<<((ostream *)local_228,(string *)&local_2a0);
      std::operator<<((ostream *)local_228,", port: ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_228);
      std::operator<<((ostream *)local_228," - Also broadcasting on the LAN to find server");
      pOVar2 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_238);
LAB_001040ba:
      std::__cxx11::ostringstream::~ostringstream(local_228);
    }
  }
  P2PFileReceiver::P2PFileReceiver(&local_b0);
  bVar1 = P2PFileReceiver::Initialize(&local_b0);
  if (bVar1) {
    if (1 < (int)Logger.ChannelMinLevel) goto LAB_001041ad;
    local_238._0_8_ = Logger.ChannelName;
    local_238._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(local_228);
    std::operator<<((ostream *)local_228,(string *)&Logger.Prefix);
    std::operator<<((ostream *)local_228,"File sending client started");
    pOVar2 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_238);
  }
  else {
    if (1 < (int)Logger.ChannelMinLevel) goto LAB_001041ad;
    local_238._0_8_ = Logger.ChannelName;
    local_238._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(local_228);
    std::operator<<((ostream *)local_228,(string *)&Logger.Prefix);
    std::operator<<((ostream *)local_228,"File sending server failed to start");
    pOVar2 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_238);
  }
  std::__cxx11::ostringstream::~ostringstream(local_228);
LAB_001041ad:
  local_2b8._M_ptr = (element_type *)0x0;
  local_2b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_260 = &local_b0;
  std::make_shared<FileReceiverServerConnection,P2PFileReceiver*>((P2PFileReceiver **)local_238);
  std::__shared_ptr<FileReceiverServerConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_2b8,
             (__shared_ptr<FileReceiverServerConnection,_(__gnu_cxx::_Lock_policy)2> *)local_238);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238 + 8));
  tonk::SDKSocket::Connect
            ((SDKJsonResult *)&local_260,&local_b0.super_SDKSocket,
             &(local_2b8._M_ptr)->super_SDKConnection,&local_2a0,0x285e);
  if (local_260._0_4_ != Tonk_Success) {
    std::__cxx11::string::string(local_280,local_258);
    if ((int)Logger.ChannelMinLevel < 3) {
      local_238._0_8_ = Logger.ChannelName;
      local_238._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(local_228);
      std::operator<<((ostream *)local_228,(string *)&Logger.Prefix);
      std::operator<<((ostream *)local_228,"Client connection failed: ");
      std::operator<<((ostream *)local_228,local_280);
      std::operator<<((ostream *)local_228,
                      " - Going to advertise on the LAN looking for connections");
      pOVar2 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_238);
      std::__cxx11::ostringstream::~ostringstream(local_228);
    }
    std::__cxx11::string::~string(local_280);
  }
  std::__cxx11::string::~string(local_258);
  getchar();
  if ((int)Logger.ChannelMinLevel < 2) {
    local_238._0_8_ = Logger.ChannelName;
    local_238._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(local_228);
    std::operator<<((ostream *)local_228,(string *)&Logger.Prefix);
    std::operator<<((ostream *)local_228,"Client shutdown");
    pOVar2 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_238);
    std::__cxx11::ostringstream::~ostringstream(local_228);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b8._M_refcount);
  tonk::SDKSocket::~SDKSocket(&local_b0.super_SDKSocket);
  if ((int)Logger.ChannelMinLevel < 2) {
    local_238._0_8_ = Logger.ChannelName;
    local_238._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(local_228);
    std::operator<<((ostream *)local_228,(string *)&Logger.Prefix);
    std::operator<<((ostream *)local_228,"Press ENTER key to terminate");
    pOVar2 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_238);
    std::__cxx11::ostringstream::~ostringstream(local_228);
  }
  getchar();
  if ((int)Logger.ChannelMinLevel < 2) {
    local_238._0_8_ = Logger.ChannelName;
    local_238._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(local_228);
    std::operator<<((ostream *)local_228,(string *)&Logger.Prefix);
    std::operator<<((ostream *)local_228,"...Key press detected.  Terminating..");
    pOVar2 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_238);
    std::__cxx11::ostringstream::~ostringstream(local_228);
  }
  std::__cxx11::string::~string((string *)&local_2a0);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    std::string hostname = "127.0.0.1";

    if (argc >= 2) {
        hostname = argv[1];
        Logger.Info("Server hostname: ", hostname, ", port: ", kFileRendezvousServerPort,
            " - Also broadcasting on the LAN to find server");
    }
    else
    {
        const char* exe = (argc > 0 ? argv[0] : "P2PFileSender");
        Logger.Info("Usage: ", exe, " <Rendezvous Server Hostname>");
    }

    {
        P2PFileReceiver receiver;

        if (receiver.Initialize()) {
            Logger.Debug("File sending client started");
        }
        else {
            Logger.Debug("File sending server failed to start");
        }

        std::shared_ptr<FileReceiverServerConnection> connection;

        {
            connection = std::make_shared<FileReceiverServerConnection>(&receiver);

            auto result = receiver.Connect(connection.get(), hostname, kFileRendezvousServerPort);

            if (result.Failed())
            {
                Logger.Info("Client connection failed: ", result.ToString(),
                    " - Going to advertise on the LAN looking for connections");
            }
        }

        ::getchar();

        Logger.Debug("Client shutdown");
    }

    Logger.Debug("Press ENTER key to terminate");

    ::getchar();

    Logger.Debug("...Key press detected.  Terminating..");

    return 0;
}